

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

_func_void_uchar_ptr_uchar_ptr_int_int_uchar_ptr_int ** __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>
::Iterator::Current(Iterator *this)

{
  _func_void_uchar_ptr_uchar_ptr_int_int_uchar_ptr_int **pp_Var1;
  
  if ((this->value_)._M_t.
      super___uniq_ptr_impl<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_std::default_delete<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>_>
      ._M_t.
      super__Tuple_impl<0UL,_void_(*const_*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_std::default_delete<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>_>
      .
      super__Head_base<0UL,_void_(*const_*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_false>
      ._M_head_impl == (_func_void_uchar_ptr_uchar_ptr_int_int_uchar_ptr_int **)0x0) {
    pp_Var1 = (_func_void_uchar_ptr_uchar_ptr_int_int_uchar_ptr_int **)operator_new(8);
    *pp_Var1 = *(this->iterator_)._M_current;
    (this->value_)._M_t.
    super___uniq_ptr_impl<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_std::default_delete<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>_>
    ._M_t.
    super__Tuple_impl<0UL,_void_(*const_*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_std::default_delete<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>_>
    .
    super__Head_base<0UL,_void_(*const_*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_false>
    ._M_head_impl = pp_Var1;
  }
  return (this->value_)._M_t.
         super___uniq_ptr_impl<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_std::default_delete<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>_>
         ._M_t.
         super__Tuple_impl<0UL,_void_(*const_*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_std::default_delete<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>_>
         .
         super__Head_base<0UL,_void_(*const_*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_false>
         ._M_head_impl;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }